

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018a1f60;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018a1bb8,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018a18b8;
  pzgeom::TPZNodeRep<20,_pztopology::TPZCube>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>,&PTR_PTR_018a0be8,nodeindices);
  (this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticCube_018a0b90;
  lVar1 = 0xf8;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x380);
  lVar1 = 0xf8;
  do {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x380);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}